

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O2

void google::protobuf::json_internal::anon_unknown_4::
     WriteEnum<google::protobuf::json_internal::UnparseProto2Descriptor>
               (JsonWriter *writer,
               Field<google::protobuf::json_internal::UnparseProto2Descriptor> field,int32_t value,
               IntegerEnumStyle int_style)

{
  MessageType MVar1;
  IntegerEnumStyle number;
  string_view name_00;
  string_view sVar2;
  StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  number = int_style;
  sVar2 = Proto2Descriptor::FieldTypeName(field);
  name_00._M_str = sVar2._M_str;
  name_00._M_len = (size_t)name_00._M_str;
  MVar1 = ClassifyMessage((json_internal *)sVar2._M_len,name_00);
  if (MVar1 == kNull) {
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"null",4);
    return;
  }
  if ((writer->options_).always_print_enums_as_ints == false) {
    Proto2Descriptor::EnumNameByNumber_abi_cxx11_
              (&name,(Proto2Descriptor *)field,(Field)(ulong)(uint)value,number);
    if (name.
        super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0 ==
        (anon_union_8_1_1246618d_for_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_1
         )0x1) {
      absl::lts_20240722::internal_statusor::
      StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::EnsureOk(&name.
                  super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
      std::__cxx11::string::string
                ((string *)&local_48,
                 (string *)
                 &name.
                  super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_1.data_);
      JsonWriter::Write<char_const*,std::__cxx11::string,char_const*>(writer,"\"",&local_48,"\"");
      std::__cxx11::string::~string((string *)&local_48);
      absl::lts_20240722::internal_statusor::
      StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~StatusOrData(&name.
                       super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     );
      return;
    }
    absl::lts_20240722::internal_statusor::
    StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~StatusOrData(&name.
                   super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 );
  }
  if (int_style == kQuoted) {
    JsonWriter::Write<char_const*,int,char_const*>(writer,"\"",value,"\"");
  }
  else {
    JsonWriter::Write(writer,value);
  }
  return;
}

Assistant:

void WriteEnum(JsonWriter& writer, Field<Traits> field, int32_t value,
               IntegerEnumStyle int_style = IntegerEnumStyle::kUnquoted) {
  if (ClassifyMessage(Traits::FieldTypeName(field)) == MessageType::kNull) {
    writer.Write("null");
    return;
  }

  if (!writer.options().always_print_enums_as_ints) {
    auto name = Traits::EnumNameByNumber(field, value);
    if (name.ok()) {
      writer.Write("\"", *name, "\"");
      return;
    }
  }

  if (int_style == IntegerEnumStyle::kQuoted) {
    writer.Write("\"", value, "\"");
  } else {
    writer.Write(value);
  }
}